

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmBase.cpp
# Opt level: O2

void __thiscall AlgorithmBase::AlgorithmBase(AlgorithmBase *this,QObject *parent)

{
  QTimer *this_00;
  Object local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  
  QThread::QThread(&this->super_QThread,parent);
  *(undefined ***)this = &PTR_metaObject_00352fa8;
  QImage::QImage(&this->target_);
  QImage::QImage(&this->allRgb_);
  this_00 = &this->iterateTimer_;
  this->iterations_ = 0;
  this->improvements_ = 0;
  QTimer::QTimer(this_00,(QObject *)this);
  QTimer::setSingleShot(SUB81(this_00,0));
  QTimer::setInterval((int)this_00);
  local_38 = 0x79;
  uStack_30 = 0;
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(AlgorithmBase::*)()>
            (local_40,(offset_in_QTimer_to_subr)this_00,(Object *)QTimer::timeout,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

AlgorithmBase::AlgorithmBase(QObject *parent)
    : QThread{parent}
    , iterations_(0)
    , improvements_(0)
    , iterateTimer_(this)
{
    iterateTimer_.setSingleShot(false);
    iterateTimer_.setInterval(0);
    connect(&iterateTimer_, &QTimer::timeout, this, &AlgorithmBase::Iterate, Qt::DirectConnection);
}